

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURL ** curl_multi_get_handles(CURLM *m)

{
  _Bool _Var1;
  uint uVar2;
  CURL **ppCVar3;
  uint_tbl *tbl;
  ulong uVar4;
  ulong uVar5;
  uint mid;
  void *entry;
  uint local_34;
  CURL *local_30;
  
  tbl = (uint_tbl *)((long)m + 8);
  uVar2 = Curl_uint_tbl_count(tbl);
  ppCVar3 = (CURL **)(*Curl_cmalloc)((ulong)(uVar2 + 1) << 3);
  if (ppCVar3 != (CURL **)0x0) {
    _Var1 = Curl_uint_tbl_first(tbl,&local_34,&local_30);
    uVar4 = 0;
    if (_Var1) {
      uVar5 = uVar4;
      do {
        uVar4 = uVar5;
        if ((*(byte *)((long)local_30 + 0x13c0) & 0x10) == 0) {
          uVar4 = (ulong)((int)uVar5 + 1);
          ppCVar3[uVar5] = local_30;
        }
        _Var1 = Curl_uint_tbl_next(tbl,local_34,&local_34,&local_30);
        uVar5 = uVar4;
      } while (_Var1);
    }
    ppCVar3[uVar4] = (CURL *)0x0;
  }
  return ppCVar3;
}

Assistant:

CURL **curl_multi_get_handles(CURLM *m)
{
  struct Curl_multi *multi = m;
  void *entry;
  unsigned int count = Curl_uint_tbl_count(&multi->xfers);
  CURL **a = malloc(sizeof(struct Curl_easy *) * (count + 1));
  if(a) {
    unsigned int i = 0, mid;

    if(Curl_uint_tbl_first(&multi->xfers, &mid, &entry)) {
      do {
        struct Curl_easy *data = entry;
        DEBUGASSERT(i < count);
        if(!data->state.internal)
          a[i++] = data;
      }
      while(Curl_uint_tbl_next(&multi->xfers, mid, &mid, &entry));
    }
    a[i] = NULL; /* last entry is a NULL */
  }
  return a;
}